

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeTFTessEvaluationShader::getTessellationControlShaderCode
          (TextureCubeMapArrayTextureSizeTFTessEvaluationShader *this)

{
  return 
  "${VERSION}\n\n${TESSELLATION_SHADER_ENABLE}\n\nprecision highp float;\n\nlayout (vertices = 1) out;\n\nvoid main()\n{\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_out[gl_InvocationID].gl_Position = vec4(0.0f,0.0f,0.0f,0.0f);\n}\n"
  ;
}

Assistant:

const char* TextureCubeMapArrayTextureSizeTFTessEvaluationShader::getTessellationControlShaderCode(void)
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${TESSELLATION_SHADER_ENABLE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"layout (vertices = 1) out;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_TessLevelInner[0] = 1.0;\n"
								"    gl_TessLevelInner[1] = 1.0;\n"
								"    gl_TessLevelOuter[0] = 1.0;\n"
								"    gl_TessLevelOuter[1] = 1.0;\n"
								"    gl_TessLevelOuter[2] = 1.0;\n"
								"    gl_TessLevelOuter[3] = 1.0;\n"
								"    gl_out[gl_InvocationID].gl_Position = vec4(0.0f,0.0f,0.0f,0.0f);\n"
								"}\n";
	return result;
}